

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

iterator __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
FindLastLessOrEqual(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *name)

{
  iterator iVar1;
  iterator iVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_void_*,_int>_>_>_>
          ::_M_upper_bound(&(this->by_symbol_)._M_t,
                           (_Link_type)
                           (this->by_symbol_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                           ,&(this->by_symbol_)._M_t._M_impl.super__Rb_tree_header._M_header,name);
  if (iVar1._M_node != (this->by_symbol_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    iVar2._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar1._M_node);
    return (iterator)iVar2._M_node;
  }
  return (iterator)iVar1._M_node;
}

Assistant:

typename map<string, Value>::iterator
SimpleDescriptorDatabase::DescriptorIndex<Value>::FindLastLessOrEqual(
    const string& name) {
  // Find the last key in the map which sorts less than or equal to the
  // symbol name.  Since upper_bound() returns the *first* key that sorts
  // *greater* than the input, we want the element immediately before that.
  typename map<string, Value>::iterator iter = by_symbol_.upper_bound(name);
  if (iter != by_symbol_.begin()) --iter;
  return iter;
}